

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

GLMClassifier_DoubleArray * __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::New(GLMClassifier_DoubleArray *this,Arena *arena)

{
  GLMClassifier_DoubleArray *this_00;
  
  this_00 = (GLMClassifier_DoubleArray *)operator_new(0x28);
  GLMClassifier_DoubleArray(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GLMClassifier_DoubleArray>(arena,this_00);
  }
  return this_00;
}

Assistant:

GLMClassifier_DoubleArray* GLMClassifier_DoubleArray::New(::google::protobuf::Arena* arena) const {
  GLMClassifier_DoubleArray* n = new GLMClassifier_DoubleArray;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}